

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O1

int ecp_group_load(mbedtls_ecp_group *grp,mbedtls_mpi_uint *p,size_t plen,mbedtls_mpi_uint *a,
                  size_t alen,mbedtls_mpi_uint *b,size_t blen,mbedtls_mpi_uint *gx,size_t gxlen,
                  mbedtls_mpi_uint *gy,size_t gylen,mbedtls_mpi_uint *n,size_t nlen)

{
  size_t sVar1;
  
  (grp->P).s = 1;
  (grp->P).n = plen >> 3;
  (grp->P).p = p;
  if (a != (mbedtls_mpi_uint *)0x0) {
    (grp->A).s = 1;
    (grp->A).n = alen >> 3;
    (grp->A).p = a;
  }
  (grp->B).s = 1;
  (grp->B).n = blen >> 3;
  (grp->B).p = b;
  (grp->N).s = 1;
  (grp->N).n = nlen >> 3;
  (grp->N).p = n;
  (grp->G).X.s = 1;
  (grp->G).X.n = gxlen >> 3;
  (grp->G).X.p = gx;
  (grp->G).Y.s = 1;
  (grp->G).Y.n = gylen >> 3;
  (grp->G).Y.p = gy;
  (grp->G).Z.s = 1;
  (grp->G).Z.n = 1;
  (grp->G).Z.p = &ecp_mpi_set1_one;
  sVar1 = mbedtls_mpi_bitlen(&grp->P);
  grp->pbits = sVar1;
  sVar1 = mbedtls_mpi_bitlen(&grp->N);
  grp->nbits = sVar1;
  grp->h = 1;
  return (int)sVar1;
}

Assistant:

static int ecp_group_load( mbedtls_ecp_group *grp,
                           const mbedtls_mpi_uint *p,  size_t plen,
                           const mbedtls_mpi_uint *a,  size_t alen,
                           const mbedtls_mpi_uint *b,  size_t blen,
                           const mbedtls_mpi_uint *gx, size_t gxlen,
                           const mbedtls_mpi_uint *gy, size_t gylen,
                           const mbedtls_mpi_uint *n,  size_t nlen)
{
    ecp_mpi_load( &grp->P, p, plen );
    if( a != NULL )
        ecp_mpi_load( &grp->A, a, alen );
    ecp_mpi_load( &grp->B, b, blen );
    ecp_mpi_load( &grp->N, n, nlen );

    ecp_mpi_load( &grp->G.X, gx, gxlen );
    ecp_mpi_load( &grp->G.Y, gy, gylen );
    ecp_mpi_set1( &grp->G.Z );

    grp->pbits = mbedtls_mpi_bitlen( &grp->P );
    grp->nbits = mbedtls_mpi_bitlen( &grp->N );

    grp->h = 1;

    return( 0 );
}